

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprPartidxExprLookup(Parse *pParse,Expr *pExpr,int iTarget)

{
  Vdbe *p;
  Vdbe *p_00;
  int iVar1;
  int p1;
  int addr;
  Op *pOVar2;
  IndexedExpr *pIVar3;
  
  pIVar3 = pParse->pIdxPartExpr;
  if (pIVar3 != (IndexedExpr *)0x0) {
    do {
      if ((pIVar3->iIdxCol == (int)pExpr->iColumn) && (pExpr->iTable == pIVar3->iDataCur)) {
        p = pParse->pVdbe;
        if (pIVar3->bMaybeNullRow == '\0') {
          iVar1 = 0;
        }
        else {
          iVar1 = sqlite3VdbeAddOp3(p,0x14,pIVar3->iIdxCur,0,0);
        }
        p1 = sqlite3ExprCodeTarget(pParse,pIVar3->pExpr,iTarget);
        p_00 = pParse->pVdbe;
        addr = sqlite3VdbeAddOp3(p_00,0x60,p1,1,0);
        sqlite3VdbeChangeP4(p_00,addr,(char *)&pIVar3->aff,1);
        if (iVar1 == 0) {
          return p1;
        }
        if (p->db->mallocFailed == '\0') {
          pOVar2 = p->aOp + iVar1;
          pOVar2->p2 = p->nOp;
        }
        else {
          pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_00244348 = p->nOp;
        }
        pOVar2->p3 = p1;
        return p1;
      }
      pIVar3 = pIVar3->pIENext;
    } while (pIVar3 != (IndexedExpr *)0x0);
  }
  return 0;
}

Assistant:

static int exprPartidxExprLookup(Parse *pParse, Expr *pExpr, int iTarget){
  IndexedExpr *p;
  for(p=pParse->pIdxPartExpr; p; p=p->pIENext){
    if( pExpr->iColumn==p->iIdxCol && pExpr->iTable==p->iDataCur ){
      Vdbe *v = pParse->pVdbe;
      int addr = 0;
      int ret;

      if( p->bMaybeNullRow ){
        addr = sqlite3VdbeAddOp1(v, OP_IfNullRow, p->iIdxCur);
      }
      ret = sqlite3ExprCodeTarget(pParse, p->pExpr, iTarget);
      sqlite3VdbeAddOp4(pParse->pVdbe, OP_Affinity, ret, 1, 0,
                        (const char*)&p->aff, 1);
      if( addr ){
        sqlite3VdbeJumpHere(v, addr);
        sqlite3VdbeChangeP3(v, addr, ret);
      }
      return ret;
    }
  }
  return 0;
}